

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* kratos::create_variables
            (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,Var *var,string *name)

{
  pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  Variable *pVVar2;
  VarType VVar3;
  uint *puVar4;
  pointer ppVar5;
  pointer pcVar6;
  _func_int *p_Var7;
  int iVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint *s;
  pointer ppVar9;
  pointer pcVar10;
  PortPackedStruct *pPVar11;
  ulong uVar12;
  basic_string_view<char> bVar13;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  string_view format_str_06;
  string_view format_str_07;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  undefined1 local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cond;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 auStack_1a8 [8];
  string value;
  undefined1 auStack_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> transformed_name;
  PortPackedStruct *p;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  slices;
  undefined1 auStack_c0 [8];
  string new_name;
  Variable v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = __return_storage_ptr__;
  if ((create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0')
     && (iVar8 = __cxa_guard_acquire(&create_variables(kratos::Var_const*,std::__cxx11::string_const&)
                                      ::empty_abi_cxx11_), iVar8 != 0)) {
    create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                     empty_abi_cxx11_.field_2;
    create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_.
    _M_string_length = 0;
    create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_.field_2.
    _M_local_buf[0] = '\0';
    __cxa_atexit(std::__cxx11::string::~string,
                 &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                         empty_abi_cxx11_);
  }
  puVar4 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  transformed_name.field_2._8_8_ = var;
  if (((ulong)((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) < 5) && (*puVar4 < 2)
     ) {
    iVar8 = (*(var->super_IRNode)._vptr_IRNode[0x17])(var);
    VVar3 = var->type_;
    if ((char)iVar8 == '\0') {
      if ((VVar3 == Slice) &&
         (iVar8 = (*(var->super_IRNode)._vptr_IRNode[0x2b])(var), (char)iVar8 != '\0')) {
        p_Var7 = var[1].super_IRNode._vptr_IRNode[0x14];
        (**(code **)(*(long *)var[1].super_IRNode.comment._M_dataplus._M_p + 0xf8))(auStack_c0);
        (**(code **)(*var[1].super_IRNode._vptr_IRNode + 0xf8))(auStack_1a8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(value.field_2._M_local_buf + 8),"[].",
                   (allocator<char> *)(new_name.field_2._M_local_buf + 8));
        string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&cond.field_2 + 8),name,(string *)((long)&value.field_2 + 8));
        ppVar1 = (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(&value.field_2._M_allocated_capacity + 1);
        std::__cxx11::string::~string((string *)ppVar1);
        pVVar2 = (Variable *)(new_name.field_2._M_local_buf + 8);
        for (uVar12 = 0; uVar12 < *(uint *)p_Var7; uVar12 = uVar12 + 1) {
          value.field_2._8_8_ = auStack_1a8;
          bVar13 = fmt::v7::to_string_view<char,_0>("{0}[{1}]");
          format_str_03.data_ = (char *)bVar13.size_;
          format_str_03.size_ = 0x2d;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)ppVar1;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_108,(detail *)bVar13.data_,format_str_03,args_03);
          value.field_2._8_8_ = *cond.field_2._8_8_;
          bVar13 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
          format_str_04.data_ = (char *)bVar13.size_;
          format_str_04.size_ = 0x2d;
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)ppVar1;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&p,(detail *)bVar13.data_,format_str_04,args_04);
          value.field_2._8_8_ = auStack_c0;
          bVar13 = fmt::v7::to_string_view<char,_0>("{0} == {1}");
          format_str_05.data_ = (char *)bVar13.size_;
          format_str_05.size_ = 0x2d;
          args_05.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_05.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)ppVar1;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_1e8,(detail *)bVar13.data_,format_str_05,args_05);
          new_name.field_2._8_8_ = &v.name._M_string_length;
          v.name._M_dataplus._M_p = (pointer)0x0;
          v.name._M_string_length._0_1_ = 0;
          v.name.field_2._8_8_ = &v.value._M_string_length;
          v.value._M_dataplus._M_p = (pointer)0x0;
          v.value._M_string_length._0_1_ = 0;
          v.value.field_2._M_local_buf[8] = '\0';
          v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
          std::__cxx11::string::_M_assign((string *)pVVar2);
          std::__cxx11::string::_M_assign((string *)(v.name.field_2._M_local_buf + 8));
          v.value.field_2._M_local_buf[8] = '\x01';
          std::
          pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<hgdb::json::Variable_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (ppVar1,pVVar2,(string *)local_1e8);
          std::
          vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
          ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                    ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                      *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._8_8_,ppVar1);
          std::
          pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(ppVar1);
          hgdb::json::Variable::~Variable(pVVar2);
          std::__cxx11::string::~string((string *)local_1e8);
          std::__cxx11::string::~string((string *)&p);
          std::__cxx11::string::~string((string *)auStack_108);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cond.field_2 + 8));
        std::__cxx11::string::~string((string *)auStack_1a8);
        std::__cxx11::string::~string((string *)auStack_c0);
        return (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._8_8_;
      }
      new_name.field_2._8_8_ = &v.name._M_string_length;
      v.name._M_dataplus._M_p = (pointer)0x0;
      v.name._M_string_length._0_1_ = 0;
      v.name.field_2._8_8_ = &v.value._M_string_length;
      v.value._M_dataplus._M_p = (pointer)0x0;
      v.value._M_string_length._0_1_ = 0;
      v.value.field_2._M_local_buf[8] = '\0';
      v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
      (*(var->super_IRNode)._vptr_IRNode[0x1f])((undefined1 *)((long)&value.field_2 + 8),var);
      std::__cxx11::string::operator=
                ((string *)(v.name.field_2._M_local_buf + 8),
                 (string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::string::_M_assign((string *)(new_name.field_2._M_local_buf + 8));
      v.value.field_2._M_local_buf[8] = '\x01';
      std::
      pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<hgdb::json::Variable_&,_true>
                ((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&value.field_2 + 8),(Variable *)((long)&new_name.field_2 + 8),
                 &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_
                );
      std::
      vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
      ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                  *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._8_8_,
                 (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&value.field_2 + 8));
      std::
      pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&value.field_2 + 8));
      hgdb::json::Variable::~Variable((Variable *)((long)&new_name.field_2 + 8));
    }
    else {
      if (VVar3 == Base) {
        (*(var->super_IRNode)._vptr_IRNode[0x2d])(&p,var);
        pcVar6 = (p->super_Port).super_Var.super_IRNode.comment._M_dataplus._M_p;
        ppVar1 = (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(&value.field_2._M_allocated_capacity + 1);
        pVVar2 = (Variable *)(new_name.field_2._M_local_buf + 8);
        for (pcVar10 = *(pointer *)&(p->super_Port).super_Var.super_IRNode.verilog_ln;
            pcVar10 != pcVar6; pcVar10 = pcVar10 + 0x30) {
          value.field_2._8_8_ = (name->_M_dataplus)._M_p;
          bVar13 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
          format_str_06.data_ = (char *)bVar13.size_;
          format_str_06.size_ = 0xdd;
          args_06.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_06.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)ppVar1;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_c0,(detail *)bVar13.data_,format_str_06,args_06);
          new_name.field_2._8_8_ = &v.name._M_string_length;
          v.name._M_dataplus._M_p = (pointer)0x0;
          v.name._M_string_length._0_1_ = 0;
          v.name.field_2._8_8_ = &v.value._M_string_length;
          v.value._M_dataplus._M_p = (pointer)0x0;
          v.value._M_string_length._0_1_ = 0;
          v.value.field_2._M_local_buf[8] = '\0';
          v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
          (**(code **)(*(long *)transformed_name.field_2._8_8_ + 0xf8))(auStack_108);
          value.field_2._8_8_ = auStack_108;
          bVar13 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
          format_str_07.data_ = (char *)bVar13.size_;
          format_str_07.size_ = 0xdd;
          args_07.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_07.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)ppVar1;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_1a8,(detail *)bVar13.data_,format_str_07,args_07);
          std::__cxx11::string::operator=
                    ((string *)(v.name.field_2._M_local_buf + 8),(string *)auStack_1a8);
          std::__cxx11::string::~string((string *)auStack_1a8);
          std::__cxx11::string::~string((string *)auStack_108);
          std::__cxx11::string::_M_assign((string *)pVVar2);
          v.value.field_2._M_local_buf[8] = '\x01';
          std::
          pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<hgdb::json::Variable_&,_true>
                    (ppVar1,pVVar2,
                     &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                      empty_abi_cxx11_);
          std::
          vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
          ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                    ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                      *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._8_8_,ppVar1);
          std::
          pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(ppVar1);
          hgdb::json::Variable::~Variable(pVVar2);
          std::__cxx11::string::~string((string *)auStack_c0);
        }
      }
      else {
        if (VVar3 != PortIO) {
          return (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._8_8_;
        }
        (*(var->super_IRNode)._vptr_IRNode[0x2e])(&p,var);
        pcVar6 = (p->super_Port).super_Var.super_IRNode.comment._M_dataplus._M_p;
        ppVar1 = (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(&value.field_2._M_allocated_capacity + 1);
        pVVar2 = (Variable *)(new_name.field_2._M_local_buf + 8);
        for (pcVar10 = *(pointer *)&(p->super_Port).super_Var.super_IRNode.verilog_ln;
            pcVar10 != pcVar6; pcVar10 = pcVar10 + 0x30) {
          value.field_2._8_8_ = (name->_M_dataplus)._M_p;
          bVar13 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
          format_str_01.data_ = (char *)bVar13.size_;
          format_str_01.size_ = 0xdd;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)ppVar1;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_c0,(detail *)bVar13.data_,format_str_01,args_01);
          new_name.field_2._8_8_ = &v.name._M_string_length;
          v.name._M_dataplus._M_p = (pointer)0x0;
          v.name._M_string_length._0_1_ = 0;
          v.name.field_2._8_8_ = &v.value._M_string_length;
          v.value._M_dataplus._M_p = (pointer)0x0;
          v.value._M_string_length._0_1_ = 0;
          v.value.field_2._M_local_buf[8] = '\0';
          v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
          (**(code **)(*(long *)transformed_name.field_2._8_8_ + 0xf8))(auStack_108);
          value.field_2._8_8_ = auStack_108;
          bVar13 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
          format_str_02.data_ = (char *)bVar13.size_;
          format_str_02.size_ = 0xdd;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)ppVar1;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_1a8,(detail *)bVar13.data_,format_str_02,args_02);
          std::__cxx11::string::operator=
                    ((string *)(v.name.field_2._M_local_buf + 8),(string *)auStack_1a8);
          std::__cxx11::string::~string((string *)auStack_1a8);
          std::__cxx11::string::~string((string *)auStack_108);
          std::__cxx11::string::_M_assign((string *)pVVar2);
          v.value.field_2._M_local_buf[8] = '\x01';
          std::
          pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<hgdb::json::Variable_&,_true>
                    (ppVar1,pVVar2,
                     &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::
                      empty_abi_cxx11_);
          std::
          vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
          ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                    ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                      *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._8_8_,ppVar1);
          std::
          pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(ppVar1);
          hgdb::json::Variable::~Variable(pVVar2);
          std::__cxx11::string::~string((string *)auStack_c0);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&slices);
    }
  }
  else {
    get_flatten_slices((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)&p,var);
    ppVar1 = (pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(&value.field_2._M_allocated_capacity + 1);
    for (pPVar11 = p;
        pPVar11 !=
        (PortPackedStruct *)
        slices.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
        pPVar11 = (PortPackedStruct *)
                  &(pPVar11->super_Port).super_Var.super_IRNode.fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::__cxx11::string::string((string *)auStack_c0,(string *)name);
      new_name.field_2._8_8_ = &v.name._M_string_length;
      v.name._M_dataplus._M_p = (pointer)0x0;
      v.name._M_string_length._0_1_ = 0;
      v.name.field_2._8_8_ = &v.value._M_string_length;
      v.value._M_dataplus._M_p = (pointer)0x0;
      v.value._M_string_length._0_1_ = 0;
      v.value.field_2._M_local_buf[8] = '\0';
      v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
      ppVar5 = (pPVar11->super_Port).super_Var.super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (ppVar9 = (pointer)(pPVar11->super_Port).super_Var.super_IRNode._vptr_IRNode;
          ppVar9 != ppVar5; ppVar9 = (pointer)((long)&(ppVar9->first)._M_dataplus._M_p + 4)) {
        value.field_2._8_8_ = auStack_c0;
        bVar13 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
        format_str.data_ = (char *)bVar13.size_;
        format_str.size_ = 0x2d;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)ppVar1;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)auStack_1a8,(detail *)bVar13.data_,format_str,args);
        std::__cxx11::string::operator=((string *)auStack_c0,(string *)auStack_1a8);
        std::__cxx11::string::~string((string *)auStack_1a8);
      }
      (**(code **)(*(long *)transformed_name.field_2._8_8_ + 0xf8))((string *)auStack_1a8);
      ppVar5 = (pPVar11->super_Port).super_Var.super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (ppVar9 = (pointer)(pPVar11->super_Port).super_Var.super_IRNode._vptr_IRNode;
          ppVar9 != ppVar5; ppVar9 = (pointer)((long)&(ppVar9->first)._M_dataplus._M_p + 4)) {
        value.field_2._8_8_ = auStack_1a8;
        bVar13 = fmt::v7::to_string_view<char,_0>("{0}[{1}]");
        format_str_00.data_ = (char *)bVar13.size_;
        format_str_00.size_ = 0x2d;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)ppVar1;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)auStack_108,(detail *)bVar13.data_,format_str_00,args_00);
        std::__cxx11::string::operator=((string *)auStack_1a8,(string *)auStack_108);
        std::__cxx11::string::~string((string *)auStack_108);
      }
      std::__cxx11::string::_M_assign((string *)(v.name.field_2._M_local_buf + 8));
      pVVar2 = (Variable *)(new_name.field_2._M_local_buf + 8);
      std::__cxx11::string::_M_assign((string *)pVVar2);
      v.value.field_2._M_local_buf[8] = '\x01';
      std::
      pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<hgdb::json::Variable_&,_true>
                (ppVar1,pVVar2,
                 &create_variables(kratos::Var_const*,std::__cxx11::string_const&)::empty_abi_cxx11_
                );
      std::
      vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
      ::emplace_back<std::pair<hgdb::json::Variable,std::__cxx11::string>>
                ((vector<std::pair<hgdb::json::Variable,std::__cxx11::string>,std::allocator<std::pair<hgdb::json::Variable,std::__cxx11::string>>>
                  *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._8_8_,ppVar1);
      std::
      pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(ppVar1);
      std::__cxx11::string::~string((string *)auStack_1a8);
      hgdb::json::Variable::~Variable(pVVar2);
      std::__cxx11::string::~string((string *)auStack_c0);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&p);
  }
  return (vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
}

Assistant:

std::vector<VarCondition> create_variables(const Var *var, const std::string &name) {
    std::vector<VarCondition> result;
    const static std::string empty;
    if (var->size().size() > 1 || var->size().front() > 1) {
        // it's an array. need to flatten it
        auto slices = get_flatten_slices(var);
        for (auto const &slice : slices) {
            std::string new_name = name;
            hgdb::json::Variable v;
            for (auto const &s : slice) new_name = ::format("{0}.{1}", new_name, s);
            std::string value = var->to_string();
            for (auto const &s : slice) value = ::format("{0}[{1}]", value, s);
            v.value = value;
            v.name = new_name;
            v.rtl = true;
            result.emplace_back(std::make_pair(v, empty));
        }
    } else if (var->is_struct()) {
        // it's a packed array
        if (var->type() == VarType::PortIO) {
            auto const *p = reinterpret_cast<const PortPackedStruct *>(var);
            auto const &def = p->packed_struct();
            for (auto const &iter : def->attributes) {
                auto const &attr_name = iter.name;
                // we need to store lots of them
                std::string new_name = ::format("{0}.{1}", name, attr_name);
                hgdb::json::Variable v;
                v.value = ::format("{0}.{1}", var->to_string(), attr_name);
                v.name = new_name;
                v.rtl = true;
                result.emplace_back(std::make_pair(v, empty));
            }
        } else if (var->type() == VarType::Base) {
            auto const *p = reinterpret_cast<const VarPackedStruct *>(var);
            auto const &def = p->packed_struct();
            for (auto const &iter : def->attributes) {
                auto const &attr_name = iter.name;
                // we need to store lots of them
                std::string new_name = ::format("{0}.{1}", name, attr_name);
                hgdb::json::Variable v;
                v.value = ::format("{0}.{1}", var->to_string(), attr_name);
                v.name = new_name;
                v.rtl = true;
                result.emplace_back(std::make_pair(v, empty));
            }
        }
    } else if (var->type() == VarType::Slice &&
               reinterpret_cast<const VarSlice *>(var)->sliced_by_var()) {
        auto const *var_var_slice = reinterpret_cast<const VarVarSlice *>(var);
        // for now, we flatten out the access and only one-level of slicing
        auto const &size = var_var_slice->parent_var->size().front();
        auto select_name = var_var_slice->sliced_var()->to_string();
        auto base_name = var_var_slice->parent_var->to_string();
        // need to get the actual name. notice that we might get to_string() name,
        // in this case it might be wrong
        auto names = string::get_tokens(name, "[].");
        auto const &new_name = names[0];
        for (auto i = 0u; i < size; i++) {
            auto transformed_name = fmt::format("{0}[{1}]", base_name, i);
            auto new_name_transformed = fmt::format("{0}.{1}", new_name, i);
            auto cond = fmt::format("{0} == {1}", select_name, i);
            // the usage is setting var[10] as a watch point
            hgdb::json::Variable v;
            v.name = new_name_transformed;
            v.value = transformed_name;
            v.rtl = true;
            result.emplace_back(std::make_pair(v, cond));
        }
    } else {
        // the normal one
        hgdb::json::Variable v;
        v.value = var->to_string();
        v.name = name;
        v.rtl = true;
        result.emplace_back(std::make_pair(v, empty));
    }
    return result;
}